

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsCreateSharedArrayBufferWithSharedContent
          (JsSharedArrayBufferContentHandle sharedContents,JsValueRef *result)

{
  anon_class_16_2_c202f9bb fn;
  JsErrorCode JVar1;
  JsValueRef *local_18;
  JsValueRef *result_local;
  JsSharedArrayBufferContentHandle sharedContents_local;
  
  fn.sharedContents = &result_local;
  fn.result = &local_18;
  local_18 = result;
  result_local = (JsValueRef *)sharedContents;
  JVar1 = ContextAPIWrapper<false,JsCreateSharedArrayBufferWithSharedContent::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsCreateSharedArrayBufferWithSharedContent(_In_ JsSharedArrayBufferContentHandle sharedContents, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        PARAM_NOT_NULL(result);

        Js::JavascriptLibrary* library = scriptContext->GetLibrary();
        *result = library->CreateSharedArrayBuffer((Js::SharedContents*)sharedContents);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(*result));
        return JsNoError;
    });
}